

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O0

bool __thiscall DOMTest::testLSExceptions(DOMTest *this)

{
  ParserAborter PVar1;
  bool bVar2;
  long *plVar3;
  DOMLSParser *parser;
  long lVar4;
  long *plVar5;
  undefined8 uVar6;
  XMLCh *pXVar7;
  DOMException *anon_var_0_2;
  char *sXml3;
  DOMDocument *doc_2;
  DOMException *anon_var_0_1;
  DOMDocument *doc_1;
  ParserSkipper skipper_1;
  char *sXml2;
  DOMException *anon_var_0;
  DOMDocument *doc;
  ParserSkipper skipper;
  DOMException *e_1;
  ParserNester nester;
  DOMLSException *e;
  ParserAborter local_40;
  ParserAborter aborter;
  DOMLSInput *input;
  DOMLSParser *domBuilder;
  DOMImplementationLS *impl;
  char *sXml;
  bool OK;
  DOMTest *this_local;
  
  plVar3 = (long *)xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(L"LS");
  parser = (DOMLSParser *)
           (**(code **)(*plVar3 + 0x10))(plVar3,1,0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter =
       (DOMLSParserFilter)
       (**(code **)(*plVar3 + 0x20))(plVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("<?xml version=\'1.0\'?><!DOCTYPE root[<!ENTITY ent1 \'Dallas. &ent3; #5668\'><!ENTITY ent2 \'1900 Dallas Road<![CDATA[ (East) ]]>\'><!ENTITY ent3 \'California. &ent4; PO\'>  <!ENTITY ent4 \'USA \'><!ENTITY ent5 \'The Content &ent6; never reached\'><!ENTITY ent6 \'ends here. <foo/>\'>]><root>&ent1; &ent2;<elem>Home </elem><elem>Test: &ent5;</elem></root>"
             ,tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter + 0x40))
            (aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter,tempStr);
  ParserAborter::ParserAborter(&local_40);
  (**(code **)(*(long *)parser + 0x30))(parser,&local_40);
  (**(code **)(*(long *)parser + 0x38))
            (parser,aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter);
  fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x138a);
  ParserAborter::~ParserAborter(&local_40);
  ParserNester::ParserNester
            ((ParserNester *)&e_1,parser,
             (DOMLSInput *)aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter);
  (**(code **)(*(long *)parser + 0x30))(parser,&e_1);
  (**(code **)(*(long *)parser + 0x38))
            (parser,aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter);
  fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x139c);
  ParserNester::~ParserNester((ParserNester *)&e_1);
  ParserSkipper::ParserSkipper((ParserSkipper *)&doc);
  (**(code **)(*(long *)parser + 0x30))(parser,&doc);
  plVar3 = (long *)(**(code **)(*(long *)parser + 0x10))();
  (**(code **)(*plVar3 + 8))(plVar3,&xercesc_4_0::XMLUni::fgDOMEntities,0);
  plVar3 = (long *)(**(code **)(*(long *)parser + 0x38))
                             (parser,aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter);
  if (plVar3 == (long *)0x0) {
LAB_00120293:
    fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x13b2);
  }
  else {
    lVar4 = (**(code **)(*plVar3 + 0x68))();
    if (lVar4 == 0) goto LAB_00120293;
    plVar3 = (long *)(**(code **)(*plVar3 + 0x68))();
    lVar4 = (**(code **)(*plVar3 + 0x200))();
    if ((lVar4 != 0) || ((int)skipper.super_DOMLSParserFilter._vptr_DOMLSParserFilter != 3))
    goto LAB_00120293;
  }
  ParserSkipper::~ParserSkipper((ParserSkipper *)&doc);
  skipper_1._8_8_ = anon_var_dwarf_2e16;
  xercesc_4_0::XMLString::transcode
            ("<?xml version=\'1.0\'?><root xmlns:x=\'urn:yyy\'><elem xmlns:x=\'urn:xxx\'>Home</elem><elem2>Test</elem2><elem>Home</elem><elem2>Test</elem2></root>"
             ,tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter + 0x40))
            (aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter,tempStr);
  ParserSkipper::ParserSkipper((ParserSkipper *)&doc_1);
  (**(code **)(*(long *)parser + 0x30))(parser,&doc_1);
  plVar3 = (long *)(**(code **)(*(long *)parser + 0x38))
                             (parser,aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter);
  if (plVar3 != (long *)0x0) {
    lVar4 = (**(code **)(*plVar3 + 0x68))();
    if (lVar4 != 0) {
      plVar3 = (long *)(**(code **)(*plVar3 + 0x68))();
      lVar4 = (**(code **)(*plVar3 + 0x200))();
      if ((lVar4 == 2) && ((int)skipper_1.super_DOMLSParserFilter._vptr_DOMLSParserFilter == 5))
      goto LAB_001204d8;
    }
  }
  fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x13cf);
LAB_001204d8:
  ParserSkipper::~ParserSkipper((ParserSkipper *)&doc_1);
  xercesc_4_0::XMLString::transcode
            ("root",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)parser + 0x30))(parser,0);
  plVar3 = (long *)(**(code **)(*(long *)parser + 0x38))
                             (parser,aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter);
  PVar1 = aborter;
  plVar5 = (long *)(**(code **)(*plVar3 + 0x68))();
  uVar6 = (**(code **)(*plVar5 + 0x1e0))();
  (**(code **)(*(long *)parser + 0x50))
            (parser,PVar1.super_DOMLSParserFilter._vptr_DOMLSParserFilter,uVar6,1);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x68))();
  plVar3 = (long *)(**(code **)(*plVar3 + 0x1e0))();
  plVar3 = (long *)(**(code **)(*plVar3 + 0x1e0))();
  pXVar7 = (XMLCh *)(**(code **)(*plVar3 + 0x10))();
  bVar2 = xercesc_4_0::XMLString::equals(pXVar7,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x13e3);
  }
  plVar3 = (long *)(**(code **)(*(long *)parser + 0x38))
                             (parser,aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter);
  PVar1 = aborter;
  plVar5 = (long *)(**(code **)(*plVar3 + 0x68))();
  uVar6 = (**(code **)(*plVar5 + 0x1e0))();
  (**(code **)(*(long *)parser + 0x50))
            (parser,PVar1.super_DOMLSParserFilter._vptr_DOMLSParserFilter,uVar6,2);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x68))();
  plVar3 = (long *)(**(code **)(*plVar3 + 0x1e0))();
  plVar3 = (long *)(**(code **)(*plVar3 + 0x1e0))();
  pXVar7 = (XMLCh *)(**(code **)(*plVar3 + 0x10))();
  bVar2 = xercesc_4_0::XMLString::equals(pXVar7,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x13ec);
  }
  plVar3 = (long *)(**(code **)(*(long *)parser + 0x38))
                             (parser,aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter);
  PVar1 = aborter;
  plVar5 = (long *)(**(code **)(*plVar3 + 0x68))();
  uVar6 = (**(code **)(*plVar5 + 0x1e0))();
  (**(code **)(*(long *)parser + 0x50))
            (parser,PVar1.super_DOMLSParserFilter._vptr_DOMLSParserFilter,uVar6,3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x68))();
  plVar3 = (long *)(**(code **)(*plVar3 + 0x1e0))();
  pXVar7 = (XMLCh *)(**(code **)(*plVar3 + 0x10))();
  bVar2 = xercesc_4_0::XMLString::equals(pXVar7,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x13f5);
  }
  plVar3 = (long *)(**(code **)(*(long *)parser + 0x38))
                             (parser,aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter);
  PVar1 = aborter;
  plVar5 = (long *)(**(code **)(*plVar3 + 0x68))();
  uVar6 = (**(code **)(*plVar5 + 0x1e0))();
  (**(code **)(*(long *)parser + 0x50))
            (parser,PVar1.super_DOMLSParserFilter._vptr_DOMLSParserFilter,uVar6,4);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x68))();
  plVar3 = (long *)(**(code **)(*plVar3 + 0x1e0))();
  plVar3 = (long *)(**(code **)(*plVar3 + 0x1f8))();
  pXVar7 = (XMLCh *)(**(code **)(*plVar3 + 0x10))();
  bVar2 = xercesc_4_0::XMLString::equals(pXVar7,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x13fe);
  }
  plVar3 = (long *)(**(code **)(*(long *)parser + 0x38))
                             (parser,aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter);
  PVar1 = aborter;
  plVar5 = (long *)(**(code **)(*plVar3 + 0x68))();
  uVar6 = (**(code **)(*plVar5 + 0x1e0))();
  (**(code **)(*(long *)parser + 0x50))
            (parser,PVar1.super_DOMLSParserFilter._vptr_DOMLSParserFilter,uVar6,5);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x68))();
  plVar3 = (long *)(**(code **)(*plVar3 + 0x1e0))();
  pXVar7 = (XMLCh *)(**(code **)(*plVar3 + 0x10))();
  bVar2 = xercesc_4_0::XMLString::equals(pXVar7,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x1407);
  }
  plVar3 = (long *)(**(code **)(*(long *)parser + 0x38))
                             (parser,aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter);
  xercesc_4_0::XMLString::transcode
            ("<x:root/>",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter + 0x40))
            (aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter,tempStr2);
  PVar1 = aborter;
  plVar5 = (long *)(**(code **)(*plVar3 + 0x68))();
  uVar6 = (**(code **)(*plVar5 + 0x1e0))();
  (**(code **)(*(long *)parser + 0x50))
            (parser,PVar1.super_DOMLSParserFilter._vptr_DOMLSParserFilter,uVar6,1);
  xercesc_4_0::XMLString::transcode
            ("urn:xxx",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x68))();
  plVar3 = (long *)(**(code **)(*plVar3 + 0x1e0))();
  plVar3 = (long *)(**(code **)(*plVar3 + 0x1e0))();
  pXVar7 = (XMLCh *)(**(code **)(*plVar3 + 0xb0))();
  bVar2 = xercesc_4_0::XMLString::equals(pXVar7,tempStr2);
  if (!bVar2) {
    fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x1415);
  }
  (**(code **)(*(long *)aborter.super_DOMLSParserFilter._vptr_DOMLSParserFilter + 0x80))();
  (**(code **)(*(long *)parser + 0x60))();
  return false;
}

Assistant:

bool DOMTest::testLSExceptions() {
    bool OK = true;

	const char* sXml="<?xml version='1.0'?>"
				"<!DOCTYPE root["
                "<!ENTITY ent1 'Dallas. &ent3; #5668'>"
                "<!ENTITY ent2 '1900 Dallas Road<![CDATA[ (East) ]]>'>"
                "<!ENTITY ent3 'California. &ent4; PO'>  "
                "<!ENTITY ent4 'USA '>"
                "<!ENTITY ent5 'The Content &ent6; never reached'>"
                "<!ENTITY ent6 'ends here. <foo/>'>"
                "]>"
                "<root>&ent1; &ent2;"
                  "<elem>Home </elem>"
                  "<elem>Test: &ent5;</elem>"
                "</root>";

    static const XMLCh gLS[] = { chLatin_L, chLatin_S, chNull };
    DOMImplementationLS *impl = (DOMImplementationLS*)DOMImplementationRegistry::getDOMImplementation(gLS);
    DOMLSParser       *domBuilder = impl->createLSParser(DOMImplementationLS::MODE_SYNCHRONOUS, 0);
    DOMLSInput        *input = impl->createLSInput();
    XMLString::transcode(sXml, tempStr, 3999);
    input->setStringData(tempStr);
    try
    {
        ParserAborter aborter;
        domBuilder->setFilter(&aborter);
        domBuilder->parse(input);

        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }
    catch(DOMLSException& e)
    {
        if(e.code!=DOMLSException::PARSE_ERR)
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }

    try
    {
        ParserNester nester(domBuilder, input);
        domBuilder->setFilter(&nester);
        domBuilder->parse(input);

        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }
    catch(DOMException& e)
    {
        if(e.code!=DOMException::INVALID_STATE_ERR)
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }

    try
    {
        ParserSkipper skipper;
        domBuilder->setFilter(&skipper);
        domBuilder->getDomConfig()->setParameter(XMLUni::fgDOMEntities, false);
        DOMDocument* doc=domBuilder->parse(input);

        // verify that we get only 3 calls: for the text node, the CDATA section and the root element
        if(doc==NULL || doc->getDocumentElement()==NULL || doc->getDocumentElement()->getChildElementCount()!=0 || skipper.fCallbackCalls!=3)
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }
    catch(DOMException&)
    {
        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }

    // this XML should trigger reuse of DOMElement
	const char* sXml2="<?xml version='1.0'?>"
                "<root xmlns:x='urn:yyy'>"
                  "<elem xmlns:x='urn:xxx'>Home</elem>"
                  "<elem2>Test</elem2>"
                  "<elem>Home</elem>"
                  "<elem2>Test</elem2>"
                "</root>";
    XMLString::transcode(sXml2, tempStr, 3999);
    input->setStringData(tempStr);
    try
    {
        ParserSkipper skipper;
        domBuilder->setFilter(&skipper);
        DOMDocument* doc=domBuilder->parse(input);

        // verify that we get only 5 calls: for the root element, the two elem2 and the two text nodes under them
        if(doc==NULL || doc->getDocumentElement()==NULL || doc->getDocumentElement()->getChildElementCount()!=2 || skipper.fCallbackCalls!=5)
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }
    catch(DOMException&)
    {
        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }

    // test for parseWithContext
    try
    {
        XMLString::transcode("root", tempStr2, 3999);
        domBuilder->setFilter(NULL);
        DOMDocument* doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_APPEND_AS_CHILDREN);
        // the first 'elem' child of 'root' must have a 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getFirstElementChild()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_REPLACE_CHILDREN);
        // the first 'elem' child of 'root' must have a 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getFirstElementChild()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_INSERT_BEFORE);
        // the first child of 'root' must be another 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_INSERT_AFTER);
        // the node after the first child of 'root' must be another 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getNextElementSibling()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_REPLACE);
        // the first child of 'root' must be another 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        // verify that namespaces are in scope
        doc=domBuilder->parse(input);
	    const char* sXml3="<x:root/>";
        XMLString::transcode(sXml3, tempStr2, 3999);
        input->setStringData(tempStr2);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_APPEND_AS_CHILDREN);
        // the first 'elem' child of 'root' must have a 'x:root' child
        XMLString::transcode("urn:xxx", tempStr2, 3999);
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getFirstElementChild()->getNamespaceURI(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }
    catch(DOMException&)
    {
        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }

    input->release();
    domBuilder->release();

    return OK;
}